

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void ptls_aead__build_iv(ptls_aead_algorithm_t *algo,uint8_t *iv,uint8_t *static_iv,uint64_t seq)

{
  uint8_t uVar1;
  long lVar2;
  long lVar3;
  
  for (lVar2 = algo->iv_size - 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *static_iv;
    static_iv = static_iv + 1;
    *iv = uVar1;
    iv = iv + 1;
  }
  lVar2 = 0x38;
  lVar3 = 0;
  do {
    iv[lVar3] = (byte)(seq >> ((byte)lVar2 & 0x3f)) ^ static_iv[lVar3];
    lVar2 = lVar2 + -8;
    lVar3 = lVar3 + 1;
  } while (lVar2 != -8);
  return;
}

Assistant:

void ptls_aead__build_iv(ptls_aead_algorithm_t *algo, uint8_t *iv, const uint8_t *static_iv, uint64_t seq)
{
    size_t iv_size = algo->iv_size, i;
    const uint8_t *s = static_iv;
    uint8_t *d = iv;

    /* build iv */
    for (i = iv_size - 8; i != 0; --i)
        *d++ = *s++;
    i = 64;
    do {
        i -= 8;
        *d++ = *s++ ^ (uint8_t)(seq >> i);
    } while (i != 0);
}